

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int libssh2_channel_request_pty_ex
              (LIBSSH2_CHANNEL *channel,char *term,uint term_len,char *modes,uint modes_len,
              int width,int height,int width_px,int height_px)

{
  uchar uVar1;
  LIBSSH2_SESSION *session;
  int iVar2;
  time_t start_time;
  char *errmsg;
  bool bVar3;
  uchar *local_90;
  uint32_t local_88;
  uint local_84;
  ulong local_80;
  ulong local_78;
  uchar *local_70;
  ulong local_68;
  char *local_60;
  char *local_58;
  packet_requirev_state_t *local_50;
  uchar *local_48;
  uchar *data;
  size_t local_38;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar2 = -0x27;
  }
  else {
    local_88 = width;
    local_60 = term;
    local_58 = modes;
    start_time = time((time_t *)0x0);
    local_84 = modes_len + term_len;
    local_68 = (ulong)(modes_len + term_len + 0x29);
    local_70 = channel->reqPTY_packet + 1;
    local_48 = channel->reqPTY_packet;
    local_50 = &channel->reqPTY_packet_requirev_state;
    local_80 = (ulong)modes_len;
    local_78 = (ulong)term_len;
    do {
      session = channel->session;
      if (channel->reqPTY_state == libssh2_NB_state_idle) {
        if (local_84 < 0x101) {
          channel->reqPTY_packet_len = local_68;
          (channel->reqPTY_packet_requirev_state).start = 0;
          local_90 = local_70;
          channel->reqPTY_packet[0] = 'b';
          _libssh2_store_u32(&local_90,(channel->remote).id);
          _libssh2_store_str(&local_90,"pty-req",7);
          *local_90 = '\x01';
          local_90 = local_90 + 1;
          _libssh2_store_str(&local_90,local_60,local_78);
          _libssh2_store_u32(&local_90,local_88);
          _libssh2_store_u32(&local_90,height);
          _libssh2_store_u32(&local_90,width_px);
          _libssh2_store_u32(&local_90,height_px);
          _libssh2_store_str(&local_90,local_58,local_80);
          channel->reqPTY_state = libssh2_NB_state_created;
          goto LAB_00114289;
        }
        iVar2 = -0x22;
        errmsg = "term + mode lengths too large";
LAB_001143af:
        iVar2 = _libssh2_error(session,iVar2,errmsg);
      }
      else {
LAB_00114289:
        if (channel->reqPTY_state != libssh2_NB_state_created) {
LAB_001142f2:
          if (channel->reqPTY_state == libssh2_NB_state_sent) {
            iVar2 = _libssh2_packet_requirev
                              (session,"cd",&data,&local_38,1,channel->reqPTY_local_channel,4,
                               local_50);
            if (iVar2 == -0x25) {
LAB_0011439a:
              bVar3 = false;
            }
            else {
              if (iVar2 != 0) {
                channel->reqPTY_state = libssh2_NB_state_idle;
                iVar2 = _libssh2_error(session,-0xe,"Failed to require the PTY package");
                goto LAB_0011439a;
              }
              uVar1 = *data;
              (*session->free)(data,&session->abstract);
              channel->reqPTY_state = libssh2_NB_state_idle;
              bVar3 = uVar1 != 'c';
              iVar2 = 0;
            }
            if (!bVar3) goto LAB_001143b6;
          }
          iVar2 = -0x16;
          errmsg = "Unable to complete request for channel request-pty";
          goto LAB_001143af;
        }
        iVar2 = _libssh2_transport_send(session,local_48,channel->reqPTY_packet_len,(uchar *)0x0,0);
        if (iVar2 == 0) {
          _libssh2_htonu32(channel->reqPTY_local_channel,(channel->local).id);
          channel->reqPTY_state = libssh2_NB_state_sent;
          goto LAB_001142f2;
        }
        if (iVar2 != -0x25) {
          channel->reqPTY_state = libssh2_NB_state_idle;
          errmsg = "Unable to send pty-request packet";
          goto LAB_001143af;
        }
        iVar2 = -0x25;
        _libssh2_error(session,-0x25,"Would block sending pty request");
      }
LAB_001143b6:
      if (iVar2 != -0x25) {
        return iVar2;
      }
      if (channel->session->api_block_mode == 0) {
        return -0x25;
      }
      iVar2 = _libssh2_wait_socket(channel->session,start_time);
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

LIBSSH2_API int
libssh2_channel_request_pty_ex(LIBSSH2_CHANNEL *channel, const char *term,
                               unsigned int term_len, const char *modes,
                               unsigned int modes_len, int width, int height,
                               int width_px, int height_px)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_request_pty(channel, term, term_len, modes,
                                     modes_len, width, height,
                                     width_px, height_px));
    return rc;
}